

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

ModuleBase * __thiscall
soul::RewritingASTVisitor::visitObject(RewritingASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  int iVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  string local_30;
  
  OVar1 = (t->super_ASTObject).objectType;
  if (OVar1 == Namespace) {
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[5];
  }
  else if (OVar1 == Processor) {
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[3];
  }
  else {
    if (OVar1 != Graph) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown AST module","");
      throwInternalCompilerError(&local_30);
    }
    UNRECOVERED_JUMPTABLE = this->_vptr_RewritingASTVisitor[4];
  }
  iVar2 = (*UNRECOVERED_JUMPTABLE)();
  return (ModuleBase *)CONCAT44(extraout_var,iVar2);
}

Assistant:

AST::ModuleBase& visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); return t;
        }
    }